

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O1

field<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
* __thiscall
discordpp::
field<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
::operator=(field<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
            *this,field<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
                  *f)

{
  _Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
  _Var1;
  _Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
  this_00;
  
  _Var1._M_head_impl =
       (f->t_)._M_t.
       super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
       .
       super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
       ._M_head_impl;
  if (_Var1._M_head_impl ==
      (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
       *)0x0) {
    this_00._M_head_impl =
         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
          *)0x0;
  }
  else {
    this_00._M_head_impl =
         (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
          *)operator_new(0x28);
    std::__detail::__variant::
    _Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
    ::_Copy_ctor_base((_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
                       *)this_00._M_head_impl,
                      (_Copy_ctor_base<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
                       *)_Var1._M_head_impl);
  }
  _Var1._M_head_impl =
       (this->t_)._M_t.
       super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
       ._M_t.
       super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
       .
       super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
       ._M_head_impl;
  (this->t_)._M_t.
  super___uniq_ptr_impl<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_std::default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>_>
  .
  super__Head_base<0UL,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_*,_false>
  ._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl !=
      (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>
       *)0x0) {
    std::
    default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
    ::operator()((default_delete<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_double,_bool>_>
                  *)this,_Var1._M_head_impl);
  }
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }